

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O0

void gen_movxmm(VARR_uint8_t *insn_varr,uint32_t offset,uint32_t reg,int b32_p,int ld_p)

{
  byte *pbVar1;
  uint8_t *pat;
  uint8_t *addr;
  int ld_p_local;
  int b32_p_local;
  uint32_t reg_local;
  uint32_t offset_local;
  VARR_uint8_t *insn_varr_local;
  
  pat = gen_movxmm::st_xmm_reg_pat;
  if (ld_p != 0) {
    pat = gen_movxmm::ld_xmm_reg_pat;
  }
  pbVar1 = push_insns(insn_varr,pat,8);
  *(uint32_t *)(pbVar1 + 4) = offset;
  if (7 < reg) {
    __assert_fail("reg <= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-x86_64.c"
                  ,0x12f,"void gen_movxmm(VARR_uint8_t *, uint32_t, uint32_t, int, int)");
  }
  pbVar1[3] = pbVar1[3] | (byte)(reg << 3);
  if (b32_p != 0) {
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

static void gen_movxmm (VARR (uint8_t) * insn_varr, uint32_t offset, uint32_t reg, int b32_p,
                        int ld_p) {
  static const uint8_t ld_xmm_reg_pat[] = {
    0xf2, 0x0f, 0x10, 0x83, 0, 0, 0, 0 /* movs[sd] <offset>(%rbx),%xmm */
  };
  static const uint8_t st_xmm_reg_pat[] = {
    0xf2, 0x0f, 0x11, 0x83, 0, 0, 0, 0 /* movs[sd] %xmm, <offset>(%rbx) */
  };
  uint8_t *addr = push_insns (insn_varr, ld_p ? ld_xmm_reg_pat : st_xmm_reg_pat,
                              ld_p ? sizeof (ld_xmm_reg_pat) : sizeof (st_xmm_reg_pat));
  memcpy (addr + 4, &offset, sizeof (uint32_t));
  assert (reg <= 7);
  addr[3] |= reg << 3;
  if (b32_p) addr[0] |= 1;
}